

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_message_digester.hxx
# Opt level: O0

uchar * __thiscall
cryptox::
evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,128ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
::finalize<unsigned_char*>
          (evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,128ul>,&EVP_DigestInit_ex,&EVP_DigestUpdate,&EVP_DigestFinal_ex>
           *this,uchar *first)

{
  int iVar1;
  uchar *puVar2;
  uint local_5c;
  uchar local_58 [4];
  uint written;
  uint8_t buffer [64];
  uchar *first_local;
  evp_message_digest_context<cryptox::message_digest_algorithm<&EVP_md4,_128UL>,_&EVP_DigestInit_ex,_&EVP_DigestUpdate,_&EVP_DigestFinal_ex>
  *this_local;
  
  buffer._56_8_ = first;
  iVar1 = EVP_DigestFinal_ex(*(EVP_MD_CTX **)this,local_58,&local_5c);
  if (iVar1 != 1) {
    local_5c = 0;
  }
  puVar2 = std::copy<unsigned_char*,unsigned_char*>
                     (local_58,local_58 + local_5c,(uchar *)buffer._56_8_);
  return puVar2;
}

Assistant:

Output finalize(Output first) {
			std::uint8_t buffer[2*EVP_MAX_BLOCK_LENGTH];

			unsigned int written;
			if (FinalFx(_context, buffer, &written) != 1)
				written = 0;

			return std::copy(buffer, buffer + written, first);
		}